

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.h
# Opt level: O0

void GEN_CS::gen_cs_example<true>(cb_to_cs *c,example *ec,label *ld,label *cs_ld)

{
  ulong uVar1;
  ostream *this;
  undefined8 uVar2;
  ulong *in_RDI;
  stringstream __msg;
  string *in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe34;
  label *in_stack_fffffffffffffe38;
  vw_exception *in_stack_fffffffffffffe40;
  example *in_stack_fffffffffffffe48;
  cb_to_cs *in_stack_fffffffffffffe50;
  stringstream local_1a8 [8];
  label *in_stack_fffffffffffffe60;
  label *in_stack_fffffffffffffe68;
  cb_to_cs *in_stack_fffffffffffffe70;
  label *in_stack_fffffffffffffe80;
  example *in_stack_fffffffffffffe88;
  cb_to_cs *in_stack_fffffffffffffe90;
  
  uVar1 = *in_RDI;
  if (uVar1 == 0) {
    gen_cs_example_dr<true>
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
               (label *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  }
  else if (uVar1 == 1) {
    gen_cs_example_dm<true>
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  }
  else {
    if (uVar1 != 2) {
      std::__cxx11::stringstream::stringstream(local_1a8);
      this = std::operator<<((ostream *)&stack0xfffffffffffffe68,
                             "Unknown cb_type specified for contextual bandit learning: ");
      std::ostream::operator<<(this,*in_RDI);
      uVar2 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,
                 in_stack_fffffffffffffe34,in_stack_fffffffffffffe28);
      __cxa_throw(uVar2,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    gen_cs_example_ips(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60
                      );
  }
  return;
}

Assistant:

void gen_cs_example(cb_to_cs& c, example& ec, CB::label& ld, COST_SENSITIVE::label& cs_ld)
{
  switch (c.cb_type)
  {
    case CB_TYPE_IPS:
      gen_cs_example_ips(c, ld, cs_ld);
      break;
    case CB_TYPE_DM:
      gen_cs_example_dm<is_learn>(c, ec, cs_ld);
      break;
    case CB_TYPE_DR:
      gen_cs_example_dr<is_learn>(c, ec, ld, cs_ld);
      break;
    default:
      THROW("Unknown cb_type specified for contextual bandit learning: " << c.cb_type);
  }
}